

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

string * spoof_hex_encoded_namespaces(string *__return_storage_ptr__,string *arg)

{
  pointer pcVar1;
  ostream *poVar2;
  int iVar3;
  ulong uVar4;
  char cVar5;
  long lVar6;
  char *p;
  string substr;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar3 = 0;
  while( true ) {
    lVar6 = (long)iVar3;
    cVar5 = (char)__return_storage_ptr__;
    if ((int)arg->_M_string_length + -3 <= iVar3) break;
    pcVar1 = (arg->_M_dataplus)._M_p;
    uVar4 = lVar6 + 1;
    if ((pcVar1[lVar6] == '\\') && (pcVar1[uVar4] == 'x')) {
      std::__cxx11::string::substr((ulong)&substr,(ulong)arg);
      strtoul(substr._M_dataplus._M_p,&p,0x10);
      if (*p == '\0') {
        std::__cxx11::string::push_back(cVar5);
        uVar4 = (ulong)(iVar3 + 4);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "Possibly malformed hex representation of a namespace: \'\\x");
        poVar2 = std::operator<<(poVar2,(string *)&substr);
        std::operator<<(poVar2,"\'\n");
        std::__cxx11::string::push_back(cVar5);
      }
      std::__cxx11::string::~string((string *)&substr);
      iVar3 = (int)uVar4;
    }
    else {
      std::__cxx11::string::push_back(cVar5);
      iVar3 = (int)uVar4;
    }
  }
  for (; lVar6 < (int)arg->_M_string_length; lVar6 = lVar6 + 1) {
    std::__cxx11::string::push_back(cVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

string spoof_hex_encoded_namespaces(const string& arg)
{
  string res;
  int pos = 0;
  while (pos < (int)arg.size() - 3)
  {
    if (arg[pos] == '\\' && arg[pos + 1] == 'x')
    {
      string substr = arg.substr(pos + 2, 2);
      char* p;
      unsigned char c = (unsigned char)strtoul(substr.c_str(), &p, 16);
      if (*p == '\0')
      {
        res.push_back(c);
        pos += 4;
      }
      else
      {
        cerr << "Possibly malformed hex representation of a namespace: '\\x" << substr << "'\n";
        res.push_back(arg[pos++]);
      }
    }
    else
      res.push_back(arg[pos++]);
  }

  while (pos < (int)arg.size())  // copy last 2 characters
    res.push_back(arg[pos++]);

  return res;
}